

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall amrex::StateData::StateData(StateData *this)

{
  BoxArray *in_RDI;
  BoxArray *this_00;
  
  this_00 = in_RDI;
  std::
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::FArrayBox>>,void>
            ((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              *)in_RDI);
  *(undefined8 *)((long)&(in_RDI->m_bat).m_op + 4) = 0;
  Box::Box((Box *)this_00);
  BoxArray::BoxArray(this_00);
  DistributionMapping::DistributionMapping((DistributionMapping *)0x1113dfc);
  *(undefined8 *)((long)&this_00[1].m_bat.m_op + 0x3c) = 0xe974e718d7d7625a;
  this_00[1].m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0xe974e718d7d7625a;
  this_00[1].m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xe974e718d7d7625a;
  this_00[1].m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0xe974e718d7d7625a;
  std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
  unique_ptr<std::default_delete<amrex::MultiFab>,void>
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)this_00);
  std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
  unique_ptr<std::default_delete<amrex::MultiFab>,void>
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)this_00);
  *(undefined8 *)((long)&this_00[2].m_bat.m_op + 4) = 0;
  return;
}

Assistant:

StateData::StateData ()
    : desc(nullptr),
      new_time{INVALID_TIME,INVALID_TIME},
      old_time{INVALID_TIME,INVALID_TIME},
      arena(nullptr)
{
}